

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__process_marker(stbi__jpeg *z,int m)

{
  bool bVar1;
  stbi_uc sVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int in_ESI;
  long in_RDI;
  int i_3;
  int ok_1;
  int i_2;
  int ok;
  int th;
  int tc;
  int q_1;
  int n;
  int i_1;
  int sizes [16];
  stbi_uc *v;
  int i;
  int t;
  int sixteen;
  int p;
  int q;
  int L;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff64;
  int local_94;
  undefined4 in_stack_ffffffffffffff70;
  int iVar7;
  int local_80;
  int local_7c;
  uint local_78 [16];
  long local_38;
  int local_2c;
  uint local_28;
  uint local_24;
  int local_20;
  uint local_1c;
  int local_18;
  int local_14;
  long local_10;
  uint local_4;
  
  local_10 = in_RDI;
  if (in_ESI == 0xc4) {
    local_18 = stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff64,0xc4));
    for (local_18 = local_18 + -2; 0 < local_18; local_18 = local_18 - local_80) {
      local_80 = 0;
      bVar3 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      uVar4 = (uint)bVar3;
      uVar5 = (int)uVar4 >> 4;
      uVar6 = uVar4 & 0xf;
      if ((1 < uVar5) || (3 < uVar6)) {
        iVar7 = stbi__err("Corrupt JPEG");
        return iVar7;
      }
      for (local_7c = 0; local_7c < 0x10; local_7c = local_7c + 1) {
        bVar3 = stbi__get8((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        local_78[local_7c] = (uint)bVar3;
        local_80 = local_78[local_7c] + local_80;
      }
      if (0x100 < local_80) {
        iVar7 = stbi__err("Corrupt JPEG");
        return iVar7;
      }
      local_18 = local_18 + -0x11;
      if (uVar5 == 0) {
        iVar7 = stbi__build_huffman((stbi__huffman *)((ulong)uVar4 << 0x20),
                                    (int *)CONCAT44(uVar6,in_stack_ffffffffffffff70));
        if (iVar7 == 0) {
          return 0;
        }
        local_38 = local_10 + (long)(int)uVar6 * 0x690 + 0x408;
      }
      else {
        iVar7 = stbi__build_huffman((stbi__huffman *)CONCAT44(uVar4,uVar5),
                                    (int *)CONCAT44(uVar6,in_stack_ffffffffffffff70));
        if (iVar7 == 0) {
          return 0;
        }
        local_38 = local_10 + (long)(int)uVar6 * 0x690 + 0x1e48;
      }
      for (local_7c = 0; local_7c < local_80; local_7c = local_7c + 1) {
        sVar2 = stbi__get8((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        *(stbi_uc *)(local_38 + local_7c) = sVar2;
      }
      if (uVar5 != 0) {
        stbi__build_fast_ac((stbi__int16 *)(local_10 + 0x3688 + (long)(int)uVar6 * 0x400),
                            (stbi__huffman *)(local_10 + 0x1a48 + (long)(int)uVar6 * 0x690));
      }
    }
    local_4 = (uint)(local_18 == 0);
  }
  else if (in_ESI == 0xdb) {
    local_18 = stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff64,0xdb));
    for (local_18 = local_18 + -2; 0 < local_18; local_18 = local_18 - iVar7) {
      bVar3 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_1c = (uint)bVar3;
      local_20 = (int)local_1c >> 4;
      local_24 = (uint)(local_20 != 0);
      local_28 = local_1c & 0xf;
      if ((local_20 != 0) && (local_20 != 1)) {
        iVar7 = stbi__err("Corrupt JPEG");
        return iVar7;
      }
      if (3 < local_28) {
        iVar7 = stbi__err("Corrupt JPEG");
        return iVar7;
      }
      for (local_2c = 0; local_2c < 0x40; local_2c = local_2c + 1) {
        if (local_24 == 0) {
          bVar3 = stbi__get8((stbi__context *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          in_stack_ffffffffffffff5c = (uint)bVar3;
        }
        else {
          in_stack_ffffffffffffff5c =
               stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff64,in_ESI));
        }
        *(short *)(local_10 + 0x3488 + (long)(int)local_28 * 0x80 + (ulong)""[local_2c] * 2) =
             (short)in_stack_ffffffffffffff5c;
      }
      iVar7 = 0x41;
      if (local_24 != 0) {
        iVar7 = 0x81;
      }
    }
    local_4 = (uint)(local_18 == 0);
  }
  else if (in_ESI == 0xdd) {
    iVar7 = stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff64,0xdd));
    if (iVar7 == 4) {
      iVar7 = stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff64,in_ESI));
      *(int *)(local_10 + 0x4868) = iVar7;
      local_4 = 1;
    }
    else {
      local_4 = stbi__err("Corrupt JPEG");
    }
  }
  else if (in_ESI == 0xff) {
    local_4 = stbi__err("Corrupt JPEG");
  }
  else if (((in_ESI < 0xe0) || (0xef < in_ESI)) && (in_ESI != 0xfe)) {
    local_4 = stbi__err("Corrupt JPEG");
  }
  else {
    local_14 = in_ESI;
    local_18 = stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff64,in_ESI));
    if (local_18 < 2) {
      if (local_14 == 0xfe) {
        local_4 = stbi__err("Corrupt JPEG");
      }
      else {
        local_4 = stbi__err("Corrupt JPEG");
      }
    }
    else {
      local_18 = local_18 + -2;
      if ((local_14 == 0xe0) && (4 < local_18)) {
        iVar7 = 1;
        for (local_94 = 0; local_94 < 5; local_94 = local_94 + 1) {
          sVar2 = stbi__get8((stbi__context *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          if (sVar2 != "JFIF"[local_94]) {
            iVar7 = 0;
          }
        }
        local_18 = local_18 + -5;
        if (iVar7 != 0) {
          *(undefined4 *)(local_10 + 0x4848) = 1;
        }
      }
      else if ((local_14 == 0xee) && (0xb < local_18)) {
        bVar1 = true;
        for (in_stack_ffffffffffffff64 = 0; in_stack_ffffffffffffff64 < 6;
            in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + 1) {
          sVar2 = stbi__get8((stbi__context *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          if (sVar2 != "Adobe"[in_stack_ffffffffffffff64]) {
            bVar1 = false;
          }
        }
        local_18 = local_18 + -6;
        if (bVar1) {
          stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
          ;
          stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff64,in_ESI));
          stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffff64,in_ESI));
          bVar3 = stbi__get8((stbi__context *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          *(uint *)(local_10 + 0x484c) = (uint)bVar3;
          local_18 = local_18 + -6;
        }
      }
      stbi__skip((stbi__context *)CONCAT44(in_stack_ffffffffffffff64,in_ESI),
                 in_stack_ffffffffffffff5c);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            if(n > 256) return stbi__err("bad DHT header","Corrupt JPEG"); // Loop over i < n would write past end of values!
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}